

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O3

ConditionalPredicateSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::ConditionalPredicateSyntax,slang::syntax::SeparatedSyntaxList<slang::syntax::ConditionalPatternSyntax>const&>
          (BumpAllocator *this,SeparatedSyntaxList<slang::syntax::ConditionalPatternSyntax> *args)

{
  ConditionalPredicateSyntax *this_00;
  
  this_00 = (ConditionalPredicateSyntax *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((ConditionalPredicateSyntax *)this->endPtr < this_00 + 1) {
    this_00 = (ConditionalPredicateSyntax *)allocateSlow(this,0x40,8);
  }
  else {
    this->head->current = (byte *)(this_00 + 1);
  }
  slang::syntax::ConditionalPredicateSyntax::ConditionalPredicateSyntax(this_00,args);
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }